

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O0

int read_single_lle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              Dwarf_Half address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,
              Dwarf_Unsigned *opsblocksize,Dwarf_Unsigned *opsoffset,Dwarf_Small **ops,
              Dwarf_Error *error)

{
  unsigned_long uVar1;
  Dwarf_Small *dbg_00;
  int iVar2;
  Dwarf_Unsigned DVar3;
  char *msg;
  Dwarf_Unsigned sectionsize;
  dwarfstring m;
  Dwarf_Unsigned DStack_148;
  int lu_res_3;
  Dwarf_Unsigned lu_local_3;
  Dwarf_Unsigned lu_leblen_3;
  Dwarf_Byte_Ptr readend_3;
  Dwarf_Unsigned _ltmp_3;
  Dwarf_Small *pDStack_120;
  int res_3;
  Dwarf_Byte_Ptr readend_2;
  Dwarf_Unsigned _ltmp_2;
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Unsigned _ltmp_1;
  Dwarf_Small *pDStack_f8;
  int res_2;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  int res_1;
  int lu_res_2;
  Dwarf_Unsigned lu_local_2;
  Dwarf_Unsigned lu_leblen_2;
  Dwarf_Unsigned DStack_c8;
  int lu_res_1;
  Dwarf_Unsigned lu_local_1;
  Dwarf_Unsigned lu_leblen_1;
  int res;
  int lu_res;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Small *startdata;
  Dwarf_Unsigned lopsoffset;
  Dwarf_Small *lopsdata;
  Dwarf_Unsigned loc_ops_len;
  Dwarf_Unsigned loc_ops_count_len;
  Dwarf_Unsigned loc_ops_overall_size;
  Dwarf_Unsigned val2;
  Dwarf_Unsigned val1;
  Dwarf_Unsigned DStack_58;
  uint code;
  Dwarf_Unsigned leblen;
  Dwarf_Unsigned count;
  uint *bytes_count_out_local;
  Dwarf_Small *pDStack_38;
  Dwarf_Half address_size_local;
  Dwarf_Small *enddata_local;
  Dwarf_Unsigned dataoffset_local;
  Dwarf_Small *data_local;
  Dwarf_Debug dbg_local;
  
  leblen = 0;
  DStack_58 = 0;
  val1._4_4_ = 0;
  val2 = 0;
  loc_ops_overall_size = 0;
  loc_ops_count_len = 0;
  loc_ops_len = 0;
  lopsdata = (Dwarf_Small *)0x0;
  lopsoffset = 0;
  startdata = (Dwarf_Small *)0x0;
  lu_leblen = 0;
  count = (Dwarf_Unsigned)bytes_count_out;
  bytes_count_out_local._6_2_ = address_size;
  pDStack_38 = enddata;
  enddata_local = (Dwarf_Small *)dataoffset;
  data_local = (Dwarf_Small *)dbg;
  if (data < enddata) {
    val1._4_4_ = (uint)*data;
    dataoffset_local = (Dwarf_Unsigned)(data + 1);
    DVar3 = 1;
    leblen = 1;
    uVar1 = (unsigned_long)address_size;
    lu_leblen = (Dwarf_Unsigned)data;
    switch(val1._4_4_) {
    case 0:
      break;
    case 1:
      lu_local = 0;
      _res = 0;
      lu_leblen_1._4_4_ = 0;
      leblen = DVar3;
      lu_leblen_1._4_4_ =
           dwarf_decode_leb128((char *)dataoffset_local,&lu_local,(Dwarf_Unsigned *)&res,
                               (char *)enddata);
      if (lu_leblen_1._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      val2 = _res;
      dataoffset_local = lu_local + dataoffset_local;
      DStack_58 = lu_local;
      leblen = lu_local + leblen;
      break;
    case 2:
    case 3:
    case 4:
      lu_leblen_1._0_4_ = 0;
      lu_local_1 = 0;
      DStack_c8 = 0;
      lu_leblen_2._4_4_ = 0;
      leblen = DVar3;
      lu_leblen_2._4_4_ =
           dwarf_decode_leb128((char *)dataoffset_local,&lu_local_1,&stack0xffffffffffffff38,
                               (char *)enddata);
      if (lu_leblen_2._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      val2 = DStack_c8;
      dataoffset_local = lu_local_1 + dataoffset_local;
      DStack_58 = lu_local_1;
      leblen = lu_local_1 + leblen;
      lu_local_2 = 0;
      _res_1 = 0;
      _ltmp._4_4_ = 0;
      _ltmp._4_4_ = dwarf_decode_leb128((char *)dataoffset_local,&lu_local_2,
                                        (Dwarf_Unsigned *)&res_1,(char *)pDStack_38);
      if (_ltmp._4_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      loc_ops_overall_size = _res_1;
      dataoffset_local = lu_local_2 + dataoffset_local;
      DStack_58 = lu_local_2;
      leblen = lu_local_2 + leblen;
      iVar2 = counted_loc_descr((Dwarf_Debug)data_local,(Dwarf_Small *)dataoffset_local,pDStack_38,
                                (Dwarf_Unsigned)enddata_local,&loc_ops_count_len,&loc_ops_len,
                                (Dwarf_Unsigned *)&lopsdata,(Dwarf_Small **)&lopsoffset,
                                (Dwarf_Unsigned *)&startdata,error);
      if (iVar2 != 0) {
        return iVar2;
      }
      leblen = loc_ops_count_len + leblen;
      dataoffset_local = loc_ops_count_len + dataoffset_local;
      lu_leblen_1._0_4_ = 0;
      break;
    case 5:
      _ltmp._0_4_ = 0;
      leblen = DVar3;
      iVar2 = counted_loc_descr(dbg,(Dwarf_Small *)dataoffset_local,enddata,dataoffset,
                                &loc_ops_count_len,&loc_ops_len,(Dwarf_Unsigned *)&lopsdata,
                                (Dwarf_Small **)&lopsoffset,(Dwarf_Unsigned *)&startdata,error);
      if (iVar2 != 0) {
        return iVar2;
      }
      dataoffset_local = loc_ops_count_len + dataoffset_local;
      leblen = loc_ops_count_len + leblen;
      _ltmp._0_4_ = 0;
      break;
    case 6:
      readend = (Dwarf_Byte_Ptr)0x0;
      pDStack_f8 = (Dwarf_Small *)(dataoffset_local + (long)(int)(uint)address_size);
      if (pDStack_f8 < dataoffset_local) {
        leblen = DVar3;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (enddata < pDStack_f8) {
        leblen = DVar3;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      leblen = DVar3;
      (*dbg->de_copy_word)(&readend,(void *)dataoffset_local,uVar1);
      val2 = (Dwarf_Unsigned)readend;
      dataoffset_local = dataoffset_local + (long)(int)(uint)bytes_count_out_local._6_2_;
      leblen = bytes_count_out_local._6_2_ + leblen;
      break;
    case 7:
      _ltmp_1._4_4_ = 0;
      readend_1 = (Dwarf_Byte_Ptr)0x0;
      _ltmp_2 = dataoffset_local + (long)(int)(uint)address_size;
      if (_ltmp_2 < dataoffset_local) {
        leblen = DVar3;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (enddata < _ltmp_2) {
        leblen = DVar3;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      leblen = DVar3;
      (*dbg->de_copy_word)(&readend_1,(void *)dataoffset_local,uVar1);
      val2 = (Dwarf_Unsigned)readend_1;
      dataoffset_local = dataoffset_local + (long)(int)(uint)bytes_count_out_local._6_2_;
      leblen = bytes_count_out_local._6_2_ + leblen;
      readend_2 = (Dwarf_Byte_Ptr)0x0;
      pDStack_120 = (Dwarf_Small *)(dataoffset_local + (long)(int)(uint)bytes_count_out_local._6_2_)
      ;
      if (pDStack_120 < dataoffset_local) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (pDStack_38 < pDStack_120) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      (**(code **)(data_local + 0x1bf8))(&readend_2,dataoffset_local,bytes_count_out_local._6_2_);
      loc_ops_overall_size = (Dwarf_Unsigned)readend_2;
      dataoffset_local = dataoffset_local + (long)(int)(uint)bytes_count_out_local._6_2_;
      leblen = bytes_count_out_local._6_2_ + leblen;
      iVar2 = counted_loc_descr((Dwarf_Debug)data_local,(Dwarf_Small *)dataoffset_local,pDStack_38,
                                (Dwarf_Unsigned)enddata_local,&loc_ops_count_len,&loc_ops_len,
                                (Dwarf_Unsigned *)&lopsdata,(Dwarf_Small **)&lopsoffset,
                                (Dwarf_Unsigned *)&startdata,error);
      if (iVar2 != 0) {
        return iVar2;
      }
      leblen = loc_ops_count_len + leblen;
      dataoffset_local = loc_ops_count_len + dataoffset_local;
      _ltmp_1._4_4_ = 0;
      break;
    case 8:
      _ltmp_3._4_4_ = 0;
      readend_3 = (Dwarf_Byte_Ptr)0x0;
      lu_leblen_3 = dataoffset_local + (long)(int)(uint)address_size;
      if (lu_leblen_3 < dataoffset_local) {
        leblen = DVar3;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
        return 1;
      }
      if (enddata < lu_leblen_3) {
        leblen = DVar3;
        _dwarf_error_string(dbg,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        return 1;
      }
      leblen = DVar3;
      (*dbg->de_copy_word)(&readend_3,(void *)dataoffset_local,uVar1);
      val2 = (Dwarf_Unsigned)readend_3;
      dataoffset_local = dataoffset_local + (long)(int)(uint)bytes_count_out_local._6_2_;
      leblen = bytes_count_out_local._6_2_ + leblen;
      lu_local_3 = 0;
      DStack_148 = 0;
      m._28_4_ = 0;
      m._28_4_ = dwarf_decode_leb128((char *)dataoffset_local,&lu_local_3,&stack0xfffffffffffffeb8,
                                     (char *)pDStack_38);
      if (m._28_4_ == 1) {
        _dwarf_error_string((Dwarf_Debug)data_local,error,0x149,
                            "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
        return 1;
      }
      loc_ops_overall_size = DStack_148;
      dataoffset_local = lu_local_3 + dataoffset_local;
      DStack_58 = lu_local_3;
      leblen = (lu_local_3 & 0xffffffff) + leblen;
      iVar2 = counted_loc_descr((Dwarf_Debug)data_local,(Dwarf_Small *)dataoffset_local,pDStack_38,
                                (Dwarf_Unsigned)enddata_local,&loc_ops_count_len,&loc_ops_len,
                                (Dwarf_Unsigned *)&lopsdata,(Dwarf_Small **)&lopsoffset,
                                (Dwarf_Unsigned *)&startdata,error);
      if (iVar2 != 0) {
        return iVar2;
      }
      leblen = loc_ops_count_len + leblen;
      dataoffset_local = loc_ops_count_len + dataoffset_local;
      _ltmp_3._4_4_ = 0;
      break;
    default:
      if (error != (Dwarf_Error *)0x0) {
        leblen = DVar3;
        dwarfstring_constructor((dwarfstring_s *)&sectionsize);
        dwarfstring_append_printf_u
                  ((dwarfstring *)&sectionsize,
                   "DW_DLE_LOCLISTS_ERROR: The loclists entry at .debug_loclists offset 0x%x",
                   (dwarfstring_u)enddata_local);
        dwarfstring_append_printf_u
                  ((dwarfstring *)&sectionsize," has code 0x%x which is unknown",(ulong)val1._4_4_);
        dbg_00 = data_local;
        msg = dwarfstring_string((dwarfstring_s *)&sectionsize);
        _dwarf_error_string((Dwarf_Debug)dbg_00,error,0x1d5,msg);
        dwarfstring_destructor((dwarfstring_s *)&sectionsize);
      }
      return 1;
    }
    if ((pDStack_38 < dataoffset_local) || (dataoffset_local < lu_leblen)) {
      _dwarf_error_string((Dwarf_Debug)data_local,error,0x1d5,
                          "DW_DLE_LOCLISTS_ERROR: The end of an lle entry is past the end of its allowed space"
                         );
      dbg_local._4_4_ = 1;
    }
    else if (*(ulong *)(data_local + 0xb68) < leblen) {
      _dwarf_error_string((Dwarf_Debug)data_local,error,0x1d5,
                          "DW_DLE_LOCLISTS_ERROR: The number of bytes in a single loclist entry is too large to be reasonable"
                         );
      dbg_local._4_4_ = 1;
    }
    else {
      *(int *)count = (int)leblen;
      *entry_kind = val1._4_4_;
      *entry_operand1 = val2;
      *entry_operand2 = loc_ops_overall_size;
      *opsblocksize = (Dwarf_Unsigned)lopsdata;
      *opsoffset = (Dwarf_Unsigned)startdata;
      *ops = (Dwarf_Small *)lopsoffset;
      dbg_local._4_4_ = 0;
    }
  }
  else {
    dataoffset_local = (Dwarf_Unsigned)data;
    _dwarf_error_string(dbg,error,0x1d5,
                        "DW_DLE_LOCLISTS_ERROR: An lle entry begins past the end of its allowed space. Corrupt DWARF."
                       );
    dbg_local._4_4_ = 1;
  }
  return dbg_local._4_4_;
}

Assistant:

static int
read_single_lle_entry(Dwarf_Debug dbg,
    Dwarf_Small    *data,
    Dwarf_Unsigned  dataoffset,
    Dwarf_Small    *enddata,
    Dwarf_Half      address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Unsigned *opsblocksize, /* Just the  expr data */
    Dwarf_Unsigned *opsoffset, /* Just the expr ops data */
    Dwarf_Small   **ops, /*  pointer to expr ops ops */
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned int   code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Unsigned loc_ops_overall_size = 0;
    Dwarf_Unsigned loc_ops_count_len = 0;
    Dwarf_Unsigned loc_ops_len = 0;
    Dwarf_Small   *lopsdata = 0;
    Dwarf_Unsigned lopsoffset = 0;
    Dwarf_Small   *startdata = 0;

    /*  Some of these have a  Counted Location Description
        in them. */
    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
            "DW_DLE_LOCLISTS_ERROR: "
            "An lle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_LLE_end_of_list: break;
    case DW_LLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_LLE_startx_endx:
    case DW_LLE_startx_length:
    case DW_LLE_offset_pair: {
        int res = 0;

        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data  += loc_ops_overall_size;

        }
        break;
    case DW_LLE_default_location: {
        int res = 0;

        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        data +=  loc_ops_overall_size;
        count +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_LLE_start_end: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_start_length: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += (unsigned)leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    default: {
        if (error) {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_LOCLISTS_ERROR: "
                "The loclists entry at .debug_loclists"
                " offset 0x%x" ,dataoffset);
            dwarfstring_append_printf_u(&m,
                " has code 0x%x which is unknown",code);
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
        }
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/
        Dwarf_Unsigned sectionsize = dbg->de_debug_loclists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The end of an lle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The number of bytes in a single "
                "loclist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }
    *bytes_count_out = (unsigned)count;
    *entry_kind      = (unsigned)code;
    *entry_operand1  = val1;
    *entry_operand2  = val2;
    *opsblocksize    = loc_ops_len;
    *opsoffset = lopsoffset;
    *ops       = lopsdata;
    return DW_DLV_OK;
}